

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

char * lua_pushstring(lua_State *L,char *s)

{
  StkId pSVar1;
  TString *pTVar2;
  TString *x_;
  char *pcVar3;
  
  if (s == (char *)0x0) {
    *(undefined1 *)((L->top).offset + 8) = 0;
    pcVar3 = (char *)0x0;
  }
  else {
    pTVar2 = luaS_new(L,s);
    pSVar1 = (L->top).p;
    *(TString **)pSVar1 = pTVar2;
    (pSVar1->val).tt_ = pTVar2->tt | 0x40;
    pcVar3 = pTVar2->contents;
  }
  (L->top).p = (StkId)((L->top).offset + 0x10);
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  return pcVar3;
}

Assistant:

LUA_API const char *lua_pushstring (lua_State *L, const char *s) {
  lua_lock(L);
  if (s == NULL)
    setnilvalue(s2v(L->top.p));
  else {
    TString *ts;
    ts = luaS_new(L, s);
    setsvalue2s(L, L->top.p, ts);
    s = getstr(ts);  /* internal copy's address */
  }
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return s;
}